

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

QColor QtMWidgets::lighterColor(QColor *c,int b)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  QColor QVar5;
  int v;
  int h;
  int a;
  int local_50;
  int local_4c;
  int local_48 [2];
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  if (b < 1) {
    uVar2 = *(undefined8 *)c;
    uVar3 = *(ulong *)((long)&c->ct + 4);
  }
  else {
    local_48[0] = 0;
    local_50 = 0;
    local_4c = 0;
    local_48[1] = 0;
    auVar4 = QColor::toHsv();
    local_40 = auVar4._0_8_;
    local_38 = auVar4._8_4_;
    local_34 = auVar4._12_2_;
    QColor::getHsv((int *)&local_40,local_48,&local_50,&local_4c);
    local_4c = b + local_4c;
    if (0xff < local_4c) {
      iVar1 = (local_50 - local_4c) + 0xff;
      local_50 = 0;
      if (0 < iVar1) {
        local_50 = iVar1;
      }
      local_4c = 0xff;
    }
    QColor::setHsv((Spec)&local_40,local_48[0],local_50,local_4c);
    auVar4 = QColor::convertTo((Spec)&local_40);
    uVar2 = auVar4._0_8_;
    uVar3 = auVar4._8_8_ & 0xffffffffffff;
  }
  QVar5._8_8_ = uVar3;
  QVar5._0_8_ = uVar2;
  return QVar5;
}

Assistant:

QColor
lighterColor( const QColor & c, int b )
{
	if( b <= 0 )
		return c;

	int h = 0;
	int s = 0;
	int v = 0;
	int a = 0;

	QColor hsv = c.toHsv();
	hsv.getHsv( &h, &s, &v, &a );

	v += b;

	if( v > 255 )
	{
		s -= v - 255;

		if( s < 0 ) s = 0;

		v = 255;
	}

	hsv.setHsv( h, s, v, a );

	return hsv.convertTo( c.spec() );
}